

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> * __thiscall
libtorrent::picker_log_alert::blocks
          (vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
           *__return_storage_ptr__,picker_log_alert *this)

{
  int iVar1;
  char *__src;
  allocator_type local_19;
  
  iVar1 = this->m_num_blocks;
  std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::vector
            (__return_storage_ptr__,(long)iVar1,&local_19);
  __src = aux::stack_allocator::ptr
                    ((this->super_peer_alert).super_torrent_alert.m_alloc._M_data,
                     (allocation_slot)(this->m_array_idx).m_idx);
  memcpy((__return_storage_ptr__->
         super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>).
         _M_impl.super__Vector_impl_data._M_start,__src,(long)iVar1 << 3);
  return __return_storage_ptr__;
}

Assistant:

std::vector<piece_block> picker_log_alert::blocks() const
	{
		// we need to copy this array to make sure the structures are properly
		// aligned, not just to have a nice API
		std::size_t const num_blocks = aux::numeric_cast<std::size_t>(m_num_blocks);
		std::vector<piece_block> ret(num_blocks);

		char const* start = m_alloc.get().ptr(m_array_idx);
		std::memcpy(ret.data(), start, num_blocks * sizeof(piece_block));

		return ret;
	}